

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

ssize_t __thiscall
TestWaitingLogSink::send(TestWaitingLogSink *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pthread_t __thread1;
  int iVar1;
  pthread_t __thread2;
  undefined4 extraout_var;
  ssize_t sVar2;
  string *in_stack_00000010;
  undefined4 in_stack_00000018;
  char *in_stack_000002b8;
  tm *in_stack_000002c0;
  int in_stack_000002cc;
  char *in_stack_000002d0;
  LogSeverity in_stack_000002dc;
  size_t in_stack_000002f0;
  int32 in_stack_000002f8;
  undefined4 in_stack_ffffffffffffff74;
  string local_50 [44];
  int local_24;
  size_t local_20;
  void *local_18;
  int local_c;
  TestWaitingLogSink *local_8;
  
  __thread1 = this->tid_;
  local_24 = __flags;
  local_20 = __n;
  local_18 = __buf;
  local_c = __fd;
  local_8 = this;
  __thread2 = pthread_self();
  iVar1 = pthread_equal(__thread1,__thread2);
  sVar2 = CONCAT44(extraout_var,iVar1);
  if (iVar1 != 0) {
    google::LogSink::ToString_abi_cxx11_
              (in_stack_000002dc,in_stack_000002d0,in_stack_000002cc,in_stack_000002c0,
               in_stack_000002b8,in_stack_000002f0,in_stack_000002f8);
    TestLogSinkWriter::Buffer
              ((TestLogSinkWriter *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000018),
               in_stack_00000010);
    sVar2 = std::__cxx11::string::~string(local_50);
  }
  return sVar2;
}

Assistant:

virtual void send(LogSeverity severity, const char* /* full_filename */,
                    const char* base_filename, int line,
                    const struct tm* tm_time,
                    const char* message, size_t message_len, int usecs) {
    // Push it to Writer thread if we are the original logging thread.
    // Note: Something like ThreadLocalLogSink is a better choice
    //       to do thread-specific LogSink logic for real.
    if (pthread_equal(tid_, pthread_self())) {
      writer_.Buffer(ToString(severity, base_filename, line,
                              tm_time, message, message_len, usecs));
    }
  }